

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

bool __thiscall
OpenMD::ForceMatrixDecomposition::excludeAtomPair
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  pointer pvVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  
  pvVar1 = (this->super_ForceDecomposition).excludesForAtom.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar2 == piVar3) {
    return false;
  }
  do {
    piVar4 = piVar2 + 1;
    bVar5 = *piVar2 == atom2;
    if (bVar5) {
      return bVar5;
    }
    piVar2 = piVar4;
  } while (piVar4 != piVar3);
  return bVar5;
}

Assistant:

bool ForceMatrixDecomposition::excludeAtomPair(int atom1, int atom2) {
    // excludesForAtom was constructed to use row/column indices in the MPI
    // version, and to use local IDs in the non-MPI version:

    for (vector<int>::iterator i = excludesForAtom[atom1].begin();
         i != excludesForAtom[atom1].end(); ++i) {
      if ((*i) == atom2) return true;
    }

    return false;
  }